

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BendTypeParser.cpp
# Opt level: O0

BendType * __thiscall
OpenMD::BendTypeParser::parseLine(BendTypeParser *this,string *line,RealType kScale)

{
  BendTypeEnum BVar1;
  undefined8 uVar2;
  void *pvVar3;
  BendType *pBVar4;
  double in_XMM0_Qa;
  StringTokenizer *this_00;
  RealType RVar5;
  int mAtt;
  int nRep;
  RealType epsilon;
  RealType sigma;
  int i;
  PolynomialBendType *pbt;
  RealType coefficient;
  int power;
  int nPairs;
  RealType k0_1;
  RealType k1_1;
  RealType k2_1;
  RealType k3_1;
  RealType k4;
  RealType k0;
  RealType k1;
  RealType k2;
  RealType k3;
  RealType kub;
  RealType s0;
  BendTypeEnum bt;
  RealType deg2rad;
  RealType ktheta;
  RealType theta0;
  int nTokens;
  BendType *bendType;
  StringTokenizer tokenizer;
  RealType in_stack_fffffffffffffa58;
  StringTokenizer *in_stack_fffffffffffffa60;
  string *in_stack_fffffffffffffa68;
  string *msg;
  StringTokenizer *in_stack_fffffffffffffa70;
  string *in_stack_fffffffffffffa78;
  StringTokenizer *in_stack_fffffffffffffa80;
  RealType in_stack_fffffffffffffa88;
  SDKBendType *in_stack_fffffffffffffa90;
  string *in_stack_fffffffffffffa98;
  StringTokenizer *in_stack_fffffffffffffaa0;
  StringTokenizer *in_stack_fffffffffffffb08;
  string local_359;
  undefined1 local_332;
  undefined1 local_30a;
  int local_2e8;
  int local_2e4;
  RealType local_2e0;
  RealType local_2d8;
  undefined1 local_2ca;
  undefined1 local_2a2;
  int local_27c;
  void *local_278;
  RealType local_270;
  int local_264;
  int local_260;
  undefined1 local_25a;
  RealType local_238;
  RealType local_230;
  RealType local_228;
  RealType local_220;
  RealType local_218;
  undefined1 local_20a;
  RealType local_1e8;
  RealType local_1e0;
  RealType local_1d8;
  RealType local_1d0;
  undefined1 local_1c2;
  RealType local_1a0;
  RealType local_198;
  undefined1 local_18a;
  undefined1 local_162;
  undefined1 local_13a;
  string local_118 [32];
  BendTypeEnum local_f8;
  undefined1 local_f2;
  double local_d0;
  double local_c8;
  double local_c0;
  int local_b4;
  BendType *local_b0;
  allocator<char> local_91;
  string local_90 [120];
  double local_18;
  
  local_18 = in_XMM0_Qa;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
             (allocator<char> *)in_stack_fffffffffffffa90);
  StringTokenizer::StringTokenizer
            (in_stack_fffffffffffffaa0,in_stack_fffffffffffffa98,(string *)in_stack_fffffffffffffa90
            );
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator(&local_91);
  local_b0 = (BendType *)0x0;
  local_b4 = StringTokenizer::countTokens(in_stack_fffffffffffffa70);
  local_d0 = 0.017453292519943295;
  if (local_b4 < 2) {
    local_f2 = 1;
    uVar2 = __cxa_allocate_exception(0x28);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
               (allocator<char> *)in_stack_fffffffffffffa90);
    OpenMDException::OpenMDException
              ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
    local_f2 = 0;
    __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::nextToken_abi_cxx11_(in_stack_fffffffffffffb08);
  BVar1 = getBendTypeEnum((BendTypeParser *)in_stack_fffffffffffffa80,in_stack_fffffffffffffa78);
  std::__cxx11::string::~string(local_118);
  local_b4 = local_b4 + -1;
  local_f8 = BVar1;
  switch(BVar1) {
  case btHarmonic:
    if (local_b4 < 2) {
      local_13a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_13a = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = RVar5 * local_d0;
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c8 = RVar5 * local_18;
    pBVar4 = (BendType *)operator_new(0x18);
    HarmonicBendType::HarmonicBendType
              ((HarmonicBendType *)in_stack_fffffffffffffa70,(RealType)in_stack_fffffffffffffa68,
               (RealType)in_stack_fffffffffffffa60);
    local_b0 = pBVar4;
    break;
  case btGhostBend:
    if (local_b4 < 2) {
      local_162 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_162 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = RVar5 * local_d0;
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c8 = RVar5 * local_18;
    pBVar4 = (BendType *)operator_new(0x18);
    HarmonicBendType::HarmonicBendType
              ((HarmonicBendType *)in_stack_fffffffffffffa70,(RealType)in_stack_fffffffffffffa68,
               (RealType)in_stack_fffffffffffffa60);
    local_b0 = pBVar4;
    break;
  case btUreyBradley:
    if (local_b4 < 4) {
      local_18a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_18a = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = RVar5 * local_d0;
    local_c8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_198 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_1a0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    pBVar4 = (BendType *)operator_new(0x30);
    UreyBradleyBendType::UreyBradleyBendType
              ((UreyBradleyBendType *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
               (RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
               (RealType)in_stack_fffffffffffffa70);
    local_b0 = pBVar4;
    break;
  case btCubic:
    if (local_b4 < 5) {
      local_1c2 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_1c2 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = RVar5 * local_d0;
    local_1d0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_1d8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_1e0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_1e8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    pBVar4 = (BendType *)operator_new(0x30);
    CubicBendType::CubicBendType
              ((CubicBendType *)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
               (RealType)in_stack_fffffffffffffa70,(RealType)in_stack_fffffffffffffa68,
               (RealType)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    local_b0 = pBVar4;
    break;
  case btQuartic:
    if (local_b4 < 6) {
      local_20a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_20a = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = RVar5 * local_d0;
    local_218 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_220 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_228 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_230 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_238 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    pBVar4 = (BendType *)operator_new(0x38);
    QuarticBendType::QuarticBendType
              ((QuarticBendType *)in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
               (RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
               (RealType)in_stack_fffffffffffffa70,(RealType)in_stack_fffffffffffffa68,
               (RealType)in_stack_fffffffffffffa60);
    local_b0 = pBVar4;
    break;
  case btPolynomial:
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = RVar5 * local_d0;
    local_b4 = local_b4 + -1;
    if ((local_b4 < 2) || (local_b4 % 2 != 0)) {
      local_25a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_25a = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    local_260 = local_b4 / 2;
    pvVar3 = operator_new(0x40);
    PolynomialBendType::PolynomialBendType
              ((PolynomialBendType *)in_stack_fffffffffffffa70,(RealType)in_stack_fffffffffffffa68);
    local_278 = pvVar3;
    for (local_27c = 0; local_27c < local_260; local_27c = local_27c + 1) {
      local_264 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffa80);
      local_270 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
      PolynomialBendType::setCoefficient
                ((PolynomialBendType *)in_stack_fffffffffffffa60,
                 (int)((ulong)in_stack_fffffffffffffa58 >> 0x20),1.21262483983984e-317);
    }
    break;
  case btCosine:
    if (local_b4 < 2) {
      local_2a2 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_2a2 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = RVar5 * local_d0;
    local_c8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    pBVar4 = (BendType *)operator_new(0x20);
    CosineBendType::CosineBendType
              ((CosineBendType *)in_stack_fffffffffffffa70,(RealType)in_stack_fffffffffffffa68,
               (RealType)in_stack_fffffffffffffa60);
    local_b0 = pBVar4;
    break;
  case btSDK:
    if (local_b4 < 6) {
      local_2ca = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_2ca = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = RVar5 * local_d0;
    local_c8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_2d8 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_2e0 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_2e4 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffa80);
    local_2e8 = StringTokenizer::nextTokenAsInt(in_stack_fffffffffffffa80);
    pBVar4 = (BendType *)operator_new(0x58);
    SDKBendType::SDKBendType
              (in_stack_fffffffffffffa90,in_stack_fffffffffffffa88,
               (RealType)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78,
               (RealType)in_stack_fffffffffffffa70,(int)((ulong)in_stack_fffffffffffffa68 >> 0x20),
               (int)in_stack_fffffffffffffa68);
    local_b0 = pBVar4;
    break;
  case btCosineSeries:
    if (local_b4 < 2) {
      local_30a = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_30a = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    this_00 = (StringTokenizer *)StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c0 = (double)this_00 * local_d0;
    RVar5 = StringTokenizer::nextTokenAsDouble(this_00);
    local_c8 = RVar5 * local_18;
    pBVar4 = (BendType *)operator_new(0x30);
    CosineSeriesBendType::CosineSeriesBendType
              ((CosineSeriesBendType *)in_stack_fffffffffffffa80,(RealType)in_stack_fffffffffffffa78
               ,(RealType)in_stack_fffffffffffffa70);
    local_b0 = pBVar4;
    break;
  case btHarmonicSine:
    if (local_b4 < 1) {
      local_332 = 1;
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
                 (allocator<char> *)in_stack_fffffffffffffa90);
      OpenMDException::OpenMDException
                ((OpenMDException *)in_stack_fffffffffffffa70,in_stack_fffffffffffffa68);
      local_332 = 0;
      __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
    }
    RVar5 = StringTokenizer::nextTokenAsDouble(in_stack_fffffffffffffaa0);
    local_c8 = RVar5 * local_18;
    pBVar4 = (BendType *)operator_new(0x18);
    HarmonicSineBendType::HarmonicSineBendType
              ((HarmonicSineBendType *)in_stack_fffffffffffffa60,in_stack_fffffffffffffa58);
    local_b0 = pBVar4;
    break;
  case btUnknown:
  default:
    uVar2 = __cxa_allocate_exception(0x28);
    msg = &local_359;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (&in_stack_fffffffffffffaa0->tokenString_,(char *)in_stack_fffffffffffffa98,
               (allocator<char> *)in_stack_fffffffffffffa90);
    OpenMDException::OpenMDException((OpenMDException *)in_stack_fffffffffffffa70,msg);
    __cxa_throw(uVar2,&OpenMDException::typeinfo,OpenMDException::~OpenMDException);
  }
  StringTokenizer::~StringTokenizer(in_stack_fffffffffffffa60);
  return local_b0;
}

Assistant:

BendType* BendTypeParser::parseLine(const std::string& line,
                                      RealType kScale) {
    StringTokenizer tokenizer(line);
    BendType* bendType = NULL;
    int nTokens        = tokenizer.countTokens();
    RealType theta0, ktheta;
    RealType deg2rad = Constants::PI / 180.0;

    if (nTokens < 2) {
      throw OpenMDException("BendTypeParser: Not enough tokens");
    }

    BendTypeEnum bt = getBendTypeEnum(tokenizer.nextToken());
    nTokens -= 1;

    // switch is a nightmare to maintain
    switch (bt) {
    case btHarmonic:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicBendType(theta0, ktheta);
      }
      break;
    case btGhostBend:
      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicBendType(theta0, ktheta);
      }
      break;

    case btUreyBradley:
      if (nTokens < 4) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0       = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta       = tokenizer.nextTokenAsDouble();
        RealType s0  = tokenizer.nextTokenAsDouble();
        RealType kub = tokenizer.nextTokenAsDouble();
        bendType     = new UreyBradleyBendType(theta0, ktheta, s0, kub);
      }
      break;

    case btCubic:
      if (nTokens < 5) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0      = tokenizer.nextTokenAsDouble() * deg2rad;
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bendType = new CubicBendType(theta0, k3, k2, k1, k0);
      }
      break;

    case btQuartic:
      if (nTokens < 6) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0      = tokenizer.nextTokenAsDouble() * deg2rad;
        RealType k4 = tokenizer.nextTokenAsDouble();
        RealType k3 = tokenizer.nextTokenAsDouble();
        RealType k2 = tokenizer.nextTokenAsDouble();
        RealType k1 = tokenizer.nextTokenAsDouble();
        RealType k0 = tokenizer.nextTokenAsDouble();

        bendType = new QuarticBendType(theta0, k4, k3, k2, k1, k0);
      }
      break;

    case btPolynomial: {
      theta0 = tokenizer.nextTokenAsDouble() * deg2rad;
      nTokens -= 1;
      if (nTokens < 2 || nTokens % 2 != 0) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        int nPairs = nTokens / 2;
        int power;
        RealType coefficient;
        PolynomialBendType* pbt = new PolynomialBendType(theta0);

        for (int i = 0; i < nPairs; ++i) {
          power       = tokenizer.nextTokenAsInt();
          coefficient = tokenizer.nextTokenAsDouble();
          pbt->setCoefficient(power, coefficient);
        }
      }
    } break;

    case btCosine:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble();
        bendType = new CosineBendType(theta0, ktheta);
      }
      break;

    case btSDK:
      if (nTokens < 6) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0           = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta           = tokenizer.nextTokenAsDouble();
        RealType sigma   = tokenizer.nextTokenAsDouble();
        RealType epsilon = tokenizer.nextTokenAsDouble();
        int nRep         = tokenizer.nextTokenAsInt();
        int mAtt         = tokenizer.nextTokenAsInt();
        bendType = new SDKBendType(theta0, ktheta, sigma, epsilon, nRep, mAtt);
      }
      break;

    case btCosineSeries:

      if (nTokens < 2) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        theta0   = tokenizer.nextTokenAsDouble() * deg2rad;
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new CosineSeriesBendType(theta0, ktheta);
      }
      break;

    case btHarmonicSine:

      if (nTokens < 1) {
        throw OpenMDException("BendTypeParser: Not enough tokens");
      } else {
        ktheta   = tokenizer.nextTokenAsDouble() * kScale;
        bendType = new HarmonicSineBendType(ktheta);
      }
      break;

    case btUnknown:
    default:
      throw OpenMDException("BendTypeParser: Unknown Bend Type");
    }

    return bendType;
  }